

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  if (argc == 3) {
    for (local_1c = 2; local_1c < 3; local_1c = local_1c + 1) {
      if (*argv[local_1c] != '-') {
        poVar1 = std::operator<<((ostream *)&std::cerr,"please \'-\' + option");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        return -1;
      }
      switch(argv[local_1c][1]) {
      case '1':
        TestLexicalAnalysis(argv[1]);
        break;
      case '2':
        TestGrammaAnalysis(argv[1]);
        break;
      case '3':
        TestSemanticAnalysis(argv[1]);
        break;
      case '4':
        TestGenerate(argv[1],false,false);
        break;
      case '5':
        TestGenerate(argv[1],true,false);
        break;
      case '6':
        TestGenerate(argv[1],true,true);
        break;
      default:
        poVar1 = std::operator<<((ostream *)&std::cerr,"invalid option: ");
        poVar1 = std::operator<<(poVar1,argv[local_1c][1]);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        return -1;
      }
    }
    argv_local._4_4_ = 0;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Usage: ./compile_test /path_to_source_code -use_mode");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
    if (argc != 3) {
        std::cerr << "Usage: ./compile_test /path_to_source_code -use_mode" << endl;
        return -1;
    } else {
        for (int i=2; i<3; ++i) {
            if (argv[i][0] == '-') {
                switch(argv[i][1]) {
                    case '1': TestLexicalAnalysis(argv[1]); break;
                    case '2': TestGrammaAnalysis(argv[1]); break;
                    case '3': TestSemanticAnalysis(argv[1]); break;
                    case '4': TestGenerate(argv[1], false, false); break;
                    case '5': TestGenerate(argv[1], true, false); break;
                    case '6': TestGenerate(argv[1], true, true); break;
                    default: {
                        std::cerr << "invalid option: " << argv[i][1] << endl;
                        return -1;
                    }
                }
            } else {
                std::cerr << "please '-' + option" << endl;
                return -1;
            }
        }
    }
    return 0;
}